

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiWindow *pIVar1;
  ImGuiColumns *pIVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0x2207,"void ImGui::Columns(int, const char *, bool)");
  }
  pIVar2 = (pIVar1->DC).CurrentColumns;
  if (pIVar2 != (ImGuiColumns *)0x0) {
    if ((pIVar2->Count == columns_count) && (pIVar2->Flags == (uint)!border)) {
      return;
    }
    EndColumns();
  }
  if (columns_count == 1) {
    return;
  }
  BeginColumns(id,columns_count,(uint)!border);
  return;
}

Assistant:

const ImWchar* ImStrbolW(const ImWchar* buf_mid_line, const ImWchar* buf_begin) // find beginning-of-line
{
    while (buf_mid_line > buf_begin && buf_mid_line[-1] != '\n')
        buf_mid_line--;
    return buf_mid_line;
}